

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decPrint.c
# Opt level: O0

void Dec_GraphPrint2_rec(FILE *pFile,Dec_Graph_t *pGraph,Dec_Node_t *pNode,int fCompl,
                        char **pNamesIn,int *pPos,int LitSizeMax)

{
  int iVar1;
  Dec_Node_t *pNode_00;
  Dec_Node_t *pNode_01;
  Dec_Node_t *pNode1;
  Dec_Node_t *pNode0;
  int *pPos_local;
  char **pNamesIn_local;
  int fCompl_local;
  Dec_Node_t *pNode_local;
  Dec_Graph_t *pGraph_local;
  FILE *pFile_local;
  
  pNode_00 = Dec_GraphNode(pGraph,(uint)pNode->eEdge0 >> 1 & 0x3fffffff);
  pNode_01 = Dec_GraphNode(pGraph,(uint)pNode->eEdge1 >> 1 & 0x3fffffff);
  iVar1 = Dec_GraphNodeIsVar(pGraph,pNode);
  if (iVar1 == 0) {
    if ((*(uint *)&pNode->field_0x10 >> 0xe & 1) == 0) {
      if ((*(uint *)&pNode_00->field_0x10 >> 0xe & 1) == 0) {
        Dec_GraphPrint_rec(pFile,pGraph,pNode_00,*(uint *)&pNode->field_0x10 >> 0xf & 1,pNamesIn,
                           pPos,LitSizeMax);
      }
      else {
        fprintf((FILE *)pFile,"(");
        *pPos = *pPos + 1;
        Dec_GraphPrint_rec(pFile,pGraph,pNode_00,*(uint *)&pNode->field_0x10 >> 0xf & 1,pNamesIn,
                           pPos,LitSizeMax);
        fprintf((FILE *)pFile,")");
        *pPos = *pPos + 1;
      }
      fprintf((FILE *)pFile," ");
      *pPos = *pPos + 1;
      Dec_GraphPrintUpdatePos(pFile,pPos,LitSizeMax);
      if ((*(uint *)&pNode_01->field_0x10 >> 0xe & 1) == 0) {
        Dec_GraphPrint_rec(pFile,pGraph,pNode_01,*(uint *)&pNode->field_0x10 >> 0x10 & 1,pNamesIn,
                           pPos,LitSizeMax);
      }
      else {
        fprintf((FILE *)pFile,"(");
        *pPos = *pPos + 1;
        Dec_GraphPrint_rec(pFile,pGraph,pNode_01,*(uint *)&pNode->field_0x10 >> 0x10 & 1,pNamesIn,
                           pPos,LitSizeMax);
        fprintf((FILE *)pFile,")");
        *pPos = *pPos + 1;
      }
    }
    else {
      if ((*(uint *)&pNode->field_0x10 >> 0xe & 1) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decPrint.c"
                      ,0x9d,
                      "void Dec_GraphPrint2_rec(FILE *, Dec_Graph_t *, Dec_Node_t *, int, char **, int *, int)"
                     );
      }
      Dec_GraphPrint_rec(pFile,pGraph,pNode_00,*(uint *)&pNode->field_0x10 >> 0xf & 1,pNamesIn,pPos,
                         LitSizeMax);
      fprintf((FILE *)pFile," + ");
      *pPos = *pPos + 3;
      Dec_GraphPrintUpdatePos(pFile,pPos,LitSizeMax);
      Dec_GraphPrint_rec(pFile,pGraph,pNode_01,*(uint *)&pNode->field_0x10 >> 0x10 & 1,pNamesIn,pPos
                         ,LitSizeMax);
    }
  }
  else {
    iVar1 = Dec_GraphNodeInt(pGraph,pNode);
    iVar1 = Dec_GraphPrintGetLeafName(pFile,iVar1,fCompl,pNamesIn);
    *pPos = iVar1 + *pPos;
  }
  return;
}

Assistant:

void Dec_GraphPrint2_rec( FILE * pFile, Dec_Graph_t * pGraph, Dec_Node_t * pNode, int fCompl, char * pNamesIn[], int * pPos, int LitSizeMax )
{
    Dec_Node_t * pNode0, * pNode1;
    pNode0 = Dec_GraphNode(pGraph, pNode->eEdge0.Node);
    pNode1 = Dec_GraphNode(pGraph, pNode->eEdge1.Node);
    if ( Dec_GraphNodeIsVar(pGraph, pNode) ) // FT_NODE_LEAF )
    {
        (*pPos) += Dec_GraphPrintGetLeafName( pFile, Dec_GraphNodeInt(pGraph,pNode), fCompl, pNamesIn );
        return;
    }
    if ( !pNode->fNodeOr ) // FT_NODE_AND )
    {
        if ( !pNode0->fNodeOr ) // != FT_NODE_OR )
            Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->fCompl0, pNamesIn, pPos, LitSizeMax );
        else
        {
            fprintf( pFile, "(" );
            (*pPos)++;
            Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->fCompl0, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, ")" );
            (*pPos)++;
        }
        fprintf( pFile, " " );
        (*pPos)++;

        Dec_GraphPrintUpdatePos( pFile, pPos, LitSizeMax );

        if ( !pNode1->fNodeOr ) // != FT_NODE_OR )
            Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->fCompl1, pNamesIn, pPos, LitSizeMax );
        else
        {
            fprintf( pFile, "(" );
            (*pPos)++;
            Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->fCompl1, pNamesIn, pPos, LitSizeMax );
            fprintf( pFile, ")" );
            (*pPos)++;
        }
        return;
    }
    if ( pNode->fNodeOr ) // FT_NODE_OR )
    {
        Dec_GraphPrint_rec( pFile, pGraph, pNode0, pNode->fCompl0, pNamesIn, pPos, LitSizeMax );
        fprintf( pFile, " + " );
        (*pPos) += 3;

        Dec_GraphPrintUpdatePos( pFile, pPos, LitSizeMax );

        Dec_GraphPrint_rec( pFile, pGraph, pNode1, pNode->fCompl1, pNamesIn, pPos, LitSizeMax );
        return;
    }
    assert( 0 );
}